

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> * __thiscall
SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
          (SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *this,char bits
          )

{
  if (bits < '\0') {
    __assert_fail("!std::numeric_limits< U >::is_signed || bits >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                  ,0x17a9,
                  "SafeInt<T, E> &SafeInt<signed char>::operator>>=(U) [T = signed char, E = safeint_exception_handlers::SafeInt_InvalidParameter, U = char]"
                 );
  }
  if ((byte)bits < 8) {
    *this = SUB41((int)(char)*this >> (bits & 0x1fU),0);
    return (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)this;
  }
  __assert_fail("bits < (int)safeint_internal::int_traits< T >::bitCount",
                "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                ,0x17aa,
                "SafeInt<T, E> &SafeInt<signed char>::operator>>=(U) [T = signed char, E = safeint_exception_handlers::SafeInt_InvalidParameter, U = char]"
               );
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E >& operator >>=( U bits ) SAFEINT_NOTHROW
    {
        ShiftAssert( !std::numeric_limits< U >::is_signed || bits >= 0 );
        ShiftAssert( bits < (int)safeint_internal::int_traits< T >::bitCount );

        m_int >>= bits;
        return *this;
    }